

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VMContext.cpp
# Opt level: O3

void __thiscall
Lodtalk::VMContext::executeScriptFromFile(VMContext *this,FILE *file,string *name,string *basePath)

{
  _Any_data local_50;
  code *local_40;
  code *local_38;
  FILE *local_30;
  
  local_50._8_8_ = 0;
  local_30 = file;
  local_50._M_unused._M_object = operator_new(0x18);
  *(FILE ***)local_50._M_unused._0_8_ = &local_30;
  *(string **)((long)local_50._M_unused._0_8_ + 8) = name;
  *(string **)((long)local_50._M_unused._0_8_ + 0x10) = basePath;
  local_38 = std::
             _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/VMContext.cpp:48:21)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/VMContext.cpp:48:21)>
             ::_M_manager;
  withInterpreter(this,(WithInterpreterBlock *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return;
}

Assistant:

void VMContext::executeScriptFromFile(FILE *file, const std::string &name, const std::string &basePath)
{
    withInterpreter([&](InterpreterProxy *interpreter) {
        Lodtalk::executeScriptFromFile(interpreter, file, name, basePath);
    });
}